

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O3

LClosure * luaU_undump(lua_State *L,ZIO *Z,char *name)

{
  char cVar1;
  StkId pTVar2;
  LClosure *pLVar3;
  Proto *f;
  char *why;
  LClosure *x_;
  lu_byte x;
  byte local_38;
  undefined7 uStack_37;
  LoadState local_30;
  
  cVar1 = *name;
  if (cVar1 == '\x1b') {
    name = "binary string";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    name = name + 1;
  }
  local_30.L = L;
  local_30.Z = Z;
  local_30.name = name;
  checkliteral(&local_30,"Lua","not a");
  LoadBlock(&local_30,&local_38,1);
  if (local_38 == 0x53) {
    LoadBlock(&local_30,&local_38,1);
    if (local_38 == 0) {
      checkliteral(&local_30,anon_var_dwarf_b67e,"corrupted");
      fchecksize(&local_30,4,"int");
      fchecksize(&local_30,8,"size_t");
      fchecksize(&local_30,4,"Instruction");
      fchecksize(&local_30,8,"lua_Integer");
      fchecksize(&local_30,8,"lua_Number");
      LoadBlock(&local_30,&local_38,8);
      if (CONCAT71(uStack_37,local_38) == 0x5678) {
        LoadBlock(&local_30,&local_38,8);
        if (((double)CONCAT71(uStack_37,local_38) == 370.5) &&
           (!NAN((double)CONCAT71(uStack_37,local_38)))) {
          LoadBlock(&local_30,&local_38,1);
          pLVar3 = luaF_newLclosure(L,(uint)local_38);
          pTVar2 = L->top;
          (pTVar2->value_).gc = (GCObject *)pLVar3;
          pTVar2->tt_ = 0x46;
          luaD_inctop(L);
          f = luaF_newproto(L);
          pLVar3->p = f;
          LoadFunction(&local_30,f,(TString *)0x0);
          return pLVar3;
        }
        why = "float format mismatch in";
      }
      else {
        why = "endianness mismatch in";
      }
    }
    else {
      why = "format mismatch in";
    }
  }
  else {
    why = "version mismatch in";
  }
  error(&local_30,why);
}

Assistant:

LClosure *luaU_undump(lua_State *L, ZIO *Z, const char *name) {
  LoadState S;
  LClosure *cl;
  if (*name == '@' || *name == '=')
    S.name = name + 1;
  else if (*name == LUA_SIGNATURE[0])
    S.name = "binary string";
  else
    S.name = name;
  S.L = L;
  S.Z = Z;
  checkHeader(&S);
  cl = luaF_newLclosure(L, LoadByte(&S));
  setclLvalue(L, L->top, cl);
  luaD_inctop(L);
  cl->p = luaF_newproto(L);
  LoadFunction(&S, cl->p, NULL);
  lua_assert(cl->nupvalues == cl->p->sizeupvalues);
  luai_verifycode(L, buff, cl->p);
  return cl;
}